

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3443::LoadableGetVariables
          (ChElementShellANCF_3443 *this,
          vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *mvars)

{
  pointer psVar1;
  long lVar2;
  int i;
  ulong uVar3;
  ChVariables *local_30;
  
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    psVar1 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar3)
    break;
    local_30 = (ChVariables *)
               (**(code **)(**(long **)((long)&(psVar1->
                                               super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr + lVar2) + 0x40))();
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    emplace_back<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,&local_30)
    ;
    local_30 = *(ChVariables **)
                (*(long *)((long)&(((this->m_nodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + lVar2) + 0xe8);
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    emplace_back<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,&local_30)
    ;
    local_30 = *(ChVariables **)
                (*(long *)((long)&(((this->m_nodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + lVar2) + 0x138);
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    emplace_back<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,&local_30)
    ;
    local_30 = *(ChVariables **)
                (*(long *)((long)&(((this->m_nodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDDD>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDDD,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + lVar2) + 0x188);
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    emplace_back<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)mvars,&local_30)
    ;
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void ChElementShellANCF_3443::LoadableGetVariables(std::vector<ChVariables*>& mvars) {
    for (int i = 0; i < m_nodes.size(); ++i) {
        mvars.push_back(&m_nodes[i]->Variables());
        mvars.push_back(&m_nodes[i]->Variables_D());
        mvars.push_back(&m_nodes[i]->Variables_DD());
        mvars.push_back(&m_nodes[i]->Variables_DDD());
    }
}